

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  long lVar1;
  FieldDescriptor *pFVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar7;
  ulong uVar8;
  int i_1;
  ulong uVar9;
  long lVar10;
  int i;
  long lVar11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  long *plVar6;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])();
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
  lVar10 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(CONCAT44(extraout_var,iVar4) + 0x2c); lVar11 = lVar11 + 1) {
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x30);
    if ((*(int *)(lVar1 + 0x30 + lVar10) == 2) &&
       (cVar3 = (**(code **)(*plVar6 + 0x28))(plVar6,message,lVar1 + lVar10), cVar3 == '\0')) {
      return false;
    }
    lVar10 = lVar10 + 0x78;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x60))(plVar6,message);
  for (uVar9 = 0;
      uVar8 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3, uVar9 < uVar8;
      uVar9 = uVar9 + 1) {
    pFVar2 = local_48._M_impl.super__Vector_impl_data._M_start[uVar9];
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar2 + 0x2c) * 4) == 10) {
      if (*(int *)(pFVar2 + 0x30) == 3) {
        iVar4 = (**(code **)(*plVar6 + 0x30))(plVar6,message,pFVar2);
        iVar5 = 0;
        if (iVar4 < 1) {
          iVar4 = iVar5;
        }
        while (iVar4 != iVar5) {
          plVar7 = (long *)(**(code **)(*plVar6 + 0x160))(plVar6,message,pFVar2,iVar5);
          cVar3 = (**(code **)(*plVar7 + 0x28))(plVar7);
          iVar5 = iVar5 + 1;
          if (cVar3 == '\0') goto LAB_0021ba63;
        }
      }
      else {
        plVar7 = (long *)(**(code **)(*plVar6 + 0xb0))(plVar6,message,pFVar2,0);
        cVar3 = (**(code **)(*plVar7 + 0x28))(plVar7);
        if (cVar3 == '\0') break;
      }
    }
  }
LAB_0021ba63:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_48);
  return uVar8 <= uVar9;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                          .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}